

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void __thiscall ExampleAppConsole::ClearLog(ExampleAppConsole *this)

{
  char **ppcVar1;
  int local_14;
  int i;
  ExampleAppConsole *this_local;
  
  for (local_14 = 0; local_14 < (this->Items).Size; local_14 = local_14 + 1) {
    ppcVar1 = ImVector<char_*>::operator[](&this->Items,local_14);
    free(*ppcVar1);
  }
  ImVector<char_*>::clear(&this->Items);
  return;
}

Assistant:

void    ClearLog()
    {
        for (int i = 0; i < Items.Size; i++)
            free(Items[i]);
        Items.clear();
    }